

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_cast.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
__thiscall
duckdb::StructBoundCastData::InitStructCastLocalState
          (StructBoundCastData *this,CastLocalStateParameters *parameters)

{
  _func_int **pp_Var1;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> _Var2;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> _Var3;
  BoundCastData *pBVar4;
  pointer pSVar5;
  _func_int **pp_Var6;
  CastLocalStateParameters child_params;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> local_60;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> local_58;
  _Head_base<0UL,_duckdb::StructCastLocalState_*,_false> local_50;
  _Head_base<0UL,_duckdb::FunctionLocalState_*,_false> local_48;
  ClientContext *local_40;
  _func_int *local_38;
  
  local_48._M_head_impl = (FunctionLocalState *)this;
  pBVar4 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&parameters->cast_data);
  make_uniq<duckdb::StructCastLocalState>();
  pp_Var1 = pBVar4[2]._vptr_BoundCastData;
  for (pp_Var6 = pBVar4[1]._vptr_BoundCastData; pp_Var6 != pp_Var1; pp_Var6 = pp_Var6 + 3) {
    local_60._M_head_impl = (FunctionLocalState *)0x0;
    if (pp_Var6[1] != (_func_int *)0x0) {
      local_38 = pp_Var6[2];
      local_40 = (parameters->context).ptr;
      (*pp_Var6[1])(&local_58,&local_40);
      _Var3._M_head_impl = local_58._M_head_impl;
      _Var2._M_head_impl = local_60._M_head_impl;
      local_58._M_head_impl = (FunctionLocalState *)0x0;
      local_60._M_head_impl = _Var3._M_head_impl;
      if (_Var2._M_head_impl != (FunctionLocalState *)0x0) {
        (*(_Var2._M_head_impl)->_vptr_FunctionLocalState[1])();
        if (local_58._M_head_impl != (FunctionLocalState *)0x0) {
          (*(local_58._M_head_impl)->_vptr_FunctionLocalState[1])();
        }
      }
    }
    pSVar5 = unique_ptr<duckdb::StructCastLocalState,_std::default_delete<duckdb::StructCastLocalState>,_true>
             ::operator->((unique_ptr<duckdb::StructCastLocalState,_std::default_delete<duckdb::StructCastLocalState>,_true>
                           *)&local_50);
    ::std::
    vector<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>>
              ((vector<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>,std::allocator<duckdb::unique_ptr<duckdb::FunctionLocalState,std::default_delete<duckdb::FunctionLocalState>,true>>>
                *)&pSVar5->local_states,
               (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>,_true>
                *)&local_60);
    if (local_60._M_head_impl != (FunctionLocalState *)0x0) {
      (*(local_60._M_head_impl)->_vptr_FunctionLocalState[1])();
    }
  }
  (local_48._M_head_impl)->_vptr_FunctionLocalState = (_func_int **)local_50._M_head_impl;
  return (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         (unique_ptr<duckdb::FunctionLocalState,_std::default_delete<duckdb::FunctionLocalState>_>)
         local_48._M_head_impl;
}

Assistant:

unique_ptr<FunctionLocalState> StructBoundCastData::InitStructCastLocalState(CastLocalStateParameters &parameters) {
	auto &cast_data = parameters.cast_data->Cast<StructBoundCastData>();
	auto result = make_uniq<StructCastLocalState>();

	for (auto &entry : cast_data.child_cast_info) {
		unique_ptr<FunctionLocalState> child_state;
		if (entry.init_local_state) {
			CastLocalStateParameters child_params(parameters, entry.cast_data);
			child_state = entry.init_local_state(child_params);
		}
		result->local_states.push_back(std::move(child_state));
	}
	return std::move(result);
}